

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O1

void replay_init_worker(__cilkrts_worker *w,global_state_t *g)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ped_type_t pVar5;
  FILE *pFVar6;
  char *pcVar7;
  replay_entry_t *prVar8;
  bool bVar9;
  long lVar10;
  replay_entry_t *prVar11;
  int32_t i2;
  int32_t i1;
  char ped_type [16];
  char worker_file_name [512];
  uint local_658;
  uint local_654;
  __cilkrts_worker *local_650;
  long local_648 [2];
  undefined4 local_638;
  undefined3 uStack_634;
  char local_238 [520];
  
  if (g->record_or_replay == RECORD_REPLAY_NONE) {
    return;
  }
  if (g->record_or_replay == REPLAY_LOG) {
    local_654 = 0xffffffff;
    local_658 = 0xffffffff;
    snprintf_s_si(local_238,0x200,"%s%d.cilklog",w->g->record_replay_file_name,w->self);
    pFVar6 = fopen(local_238,"r");
    if (pFVar6 == (FILE *)0x0) {
LAB_0010c56d:
      replay_init_worker_cold_4();
    }
    else {
      iVar3 = feof(pFVar6);
      lVar10 = 1;
      if (iVar3 == 0) {
        iVar3 = 1;
        local_650 = w;
        do {
          pcVar7 = fgets((char *)&local_638,0x400,pFVar6);
          if (pcVar7 != (char *)0x0) {
            iVar3 = iVar3 + (uint)(CONCAT31(uStack_634,local_638._3_1_) != 0x7372656b ||
                                  local_638 != 0x6b726f57);
          }
          iVar4 = feof(pFVar6);
        } while (iVar4 == 0);
        lVar10 = (long)iVar3;
        w = local_650;
      }
      prVar8 = (replay_entry_t *)__cilkrts_malloc(lVar10 * 0x10);
      w->l->replay_list_root = prVar8;
      prVar8[lVar10 + -1].m_type = ped_type_last;
      rewind(pFVar6);
      prVar8 = w->l->replay_list_root;
      iVar3 = feof(pFVar6);
      if (iVar3 == 0) {
        do {
          iVar3 = __isoc99_fscanf(pFVar6,"%s %s %d %d\n",local_648,&local_638,&local_654,&local_658)
          ;
          if (iVar3 == -1) break;
          if (iVar3 != 4) goto LAB_0010c57c;
          if (local_648[0] == 0x7372656b726f57) {
            uVar2 = w->g->P;
            if (local_654 != uVar2) {
              cilkos_error("Cannot continue replay: number of workers(%d) doesn\'t match that from the recording(%d).\n"
                           ,(ulong)uVar2,(ulong)local_654);
            }
            if (local_658 != 1) {
              cilkos_error("Pedigree file version %d doesn\'t match current version %d - cannot continue.\n"
                           ,(ulong)local_658,1);
            }
          }
          else {
            replay_entry_t::load(prVar8,(char *)local_648,(char *)&local_638,local_654,local_658);
            prVar8 = prVar8 + 1;
          }
          iVar3 = feof(pFVar6);
        } while (iVar3 == 0);
      }
      if (prVar8->m_type == ped_type_last) {
        w->l->replay_list_entry = w->l->replay_list_root;
        fclose(pFVar6);
        prVar8 = w->l->replay_list_root;
        while( true ) {
          if (prVar8->m_type == ped_type_steal) {
            uVar1 = prVar8->m_value;
            if (((short)uVar1 < 0) || (g->total_workers <= (int)(short)uVar1)) {
              replay_init_worker_cold_2();
            }
            else {
              prVar11 = g->workers[uVar1]->l->replay_list_root;
              if (prVar11 != (replay_entry_t *)0x0) {
                pVar5 = prVar11->m_type;
                if (pVar5 != ped_type_last) {
                  bVar9 = false;
                  do {
                    if (((pVar5 == ped_type_orphaned) &&
                        (prVar8->m_pedigree_len == prVar11->m_pedigree_len)) &&
                       (iVar3 = bcmp(prVar8->m_reverse_pedigree,prVar11->m_reverse_pedigree,
                                     (long)prVar8->m_pedigree_len << 3), iVar3 == 0)) {
                      prVar11->m_value = 0;
                      bVar9 = true;
                    }
                    pVar5 = prVar11[1].m_type;
                  } while ((pVar5 != ped_type_last) && (prVar11 = prVar11 + 1, !bVar9));
                }
                goto LAB_0010c408;
              }
            }
            replay_init_worker_cold_3();
            goto LAB_0010c56d;
          }
          if (prVar8->m_type == ped_type_last) break;
LAB_0010c408:
          prVar8 = prVar8 + 1;
        }
        goto LAB_0010c411;
      }
    }
    replay_init_worker_cold_1();
LAB_0010c577:
    replay_init_worker_cold_5();
LAB_0010c57c:
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                  ,0x242,"4 == fret");
  }
LAB_0010c411:
  if (g->record_or_replay == RECORD_LOG) {
    snprintf_s_si((char *)&local_638,0x200,"%s%d.cilklog",g->record_replay_file_name,w->self);
    pFVar6 = fopen((char *)&local_638,"w+");
    w->l->record_replay_fptr = (FILE *)pFVar6;
    if (pFVar6 == (FILE *)0x0) goto LAB_0010c577;
    if (w->self == 0) {
      write_to_replay_log(w,"Workers",(__cilkrts_pedigree *)0x0,g->P,1);
    }
  }
  return;
}

Assistant:

void replay_init_worker(__cilkrts_worker* w, global_state_t *g)
{
    char worker_file_name[512];

    // If we're not recording or replaying a log, we're done.  All of the
    // fields in the global_state_t or local_state_t are already initialized
    // to default values.
    if (RECORD_REPLAY_NONE == g->record_or_replay)
        return;

    // If we're replaying a log, read worker's log and construct the
    // in-memory log
    if (REPLAY_LOG == g->record_or_replay)
    {
        // This function will also initialize and fill the worker's
        // replay list
        load_recorded_log(w);

        // Scan for orphans with no matching steal.  Mark them so they'll be
        // skipped as we advance through the log.
        scan_for_matching_steals(g, w->l->replay_list_root);

        // If we're recording the logs while replaying, create the log files.
        // This will only be used for debugging.  Create the logs in the
        // current directory.  It should be as good a place as any...
#if RECORD_ON_REPLAY
        cilk_snprintf_i(worker_file_name, sizeof(worker_file_name),
                        "replay_log_%d.cilklog",  w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log (w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
#endif // RECORD_ON_REPLAY
    }

    // If we're recording, create the log files
    if (RECORD_LOG == g->record_or_replay)
    {
        cilk_snprintf_si(worker_file_name, sizeof(worker_file_name),
                         "%s%d.cilklog", g->record_replay_file_name, w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log(w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
    }
}